

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkconnection.cpp
# Opt level: O0

void __thiscall
QHttpNetworkConnectionPrivate::_q_hostLookupFinished
          (QHttpNetworkConnectionPrivate *this,QHostInfo *info)

{
  bool bVar1;
  QHttpNetworkConnectionPrivate *in_RDI;
  long in_FS_OFFSET;
  QHttpNetworkReply *currentReply;
  HttpMessagePair *h2Pair;
  add_const_t<QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>_> *__range6;
  NetworkError lookupError;
  NetworkLayerProtocol protocol;
  QHostAddress *address;
  QList<QHostAddress> *__range1;
  bool foundAddress;
  bool bIpv6;
  bool bIpv4;
  const_iterator __end6;
  const_iterator __begin6;
  QFlags<QNetworkProxy::Capability> proxyCapabilities;
  const_iterator __end1;
  const_iterator __begin1;
  QList<QHostAddress> addresses;
  undefined4 in_stack_ffffffffffffff28;
  Capability in_stack_ffffffffffffff2c;
  QIODevice *in_stack_ffffffffffffff38;
  QHttpNetworkConnectionPrivate *in_stack_ffffffffffffff40;
  QObject *in_stack_ffffffffffffff48;
  NetworkError in_stack_ffffffffffffff5c;
  QHttpNetworkReply *in_stack_ffffffffffffff60;
  QIODevice *socket;
  undefined5 in_stack_ffffffffffffff70;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  char local_78 [32];
  const_iterator local_58;
  const_iterator local_50;
  QFlagsStorageHelper<QNetworkProxy::Capability,_4> local_44;
  QFlagsStorageHelper<QNetworkProxy::Capability,_4> local_40;
  QFlagsStorageHelper<QNetworkProxy::Capability,_4> local_3c;
  QHostAddress *local_38;
  const_iterator local_30;
  const_iterator local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar4 = 0;
  bVar3 = 0;
  bVar2 = 0;
  if (((in_RDI->networkLayerState != IPv4) && (in_RDI->networkLayerState != IPv6)) &&
     (in_RDI->networkLayerState != IPv4or6)) {
    local_20 = 0xaaaaaaaaaaaaaaaa;
    local_18 = 0xaaaaaaaaaaaaaaaa;
    local_10 = 0xaaaaaaaaaaaaaaaa;
    QHostInfo::addresses((QHostInfo *)in_stack_ffffffffffffff38);
    socket = (QIODevice *)&local_20;
    local_28.i = (QHostAddress *)0xaaaaaaaaaaaaaaaa;
    local_28 = QList<QHostAddress>::begin((QList<QHostAddress> *)in_RDI);
    local_30.i = (QHostAddress *)0xaaaaaaaaaaaaaaaa;
    local_30 = QList<QHostAddress>::end((QList<QHostAddress> *)in_RDI);
    while( true ) {
      local_38 = local_30.i;
      bVar1 = QList<QHostAddress>::const_iterator::operator!=(&local_28,local_30);
      if (!bVar1) break;
      in_stack_ffffffffffffff60 =
           (QHttpNetworkReply *)QList<QHostAddress>::const_iterator::operator*(&local_28);
      in_stack_ffffffffffffff5c = QHostAddress::protocol((QHostAddress *)0x2efda6);
      if (in_stack_ffffffffffffff5c == NoError) {
        if ((bVar2 & 1) == 0) {
          bVar2 = 1;
          in_RDI->delayIpv4 = false;
        }
        bVar4 = 1;
      }
      else if (in_stack_ffffffffffffff5c == ConnectionRefusedError) {
        if ((bVar2 & 1) == 0) {
          bVar2 = 1;
          in_RDI->delayIpv4 = true;
        }
        bVar3 = 1;
      }
      QList<QHostAddress>::const_iterator::operator++(&local_28);
    }
    if (((bVar4 & 1) == 0) || ((bVar3 & 1) == 0)) {
      if ((bVar4 & 1) == 0) {
        if ((bVar3 & 1) == 0) {
          local_3c.super_QFlagsStorage<QNetworkProxy::Capability>.i =
               (QFlagsStorage<QNetworkProxy::Capability>)0xaaaaaaaa;
          local_40.super_QFlagsStorage<QNetworkProxy::Capability>.i =
               (QFlagsStorage<QNetworkProxy::Capability>)
               QNetworkProxy::capabilities((QNetworkProxy *)in_RDI);
          QNetworkProxy::capabilities((QNetworkProxy *)in_RDI);
          local_3c.super_QFlagsStorage<QNetworkProxy::Capability>.i =
               (QFlagsStorage<QNetworkProxy::Capability>)
               QFlags<QNetworkProxy::Capability>::operator|
                         ((QFlags<QNetworkProxy::Capability> *)in_RDI,
                          (QFlagsStorageHelper<QNetworkProxy::Capability,_4>)
                          SUB84(in_stack_ffffffffffffff38,0));
          local_44.super_QFlagsStorage<QNetworkProxy::Capability>.i =
               (QFlagsStorage<QNetworkProxy::Capability>)
               QFlags<QNetworkProxy::Capability>::operator&
                         ((QFlags<QNetworkProxy::Capability> *)in_RDI,in_stack_ffffffffffffff2c);
          ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_44);
          bVar1 = dequeueRequest(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
          if (bVar1) {
            emitReplyError((QHttpNetworkConnectionPrivate *)
                           CONCAT17(bVar4,CONCAT16(bVar3,CONCAT15(bVar2,in_stack_ffffffffffffff70)))
                           ,socket,in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
            in_RDI->networkLayerState = Unknown;
          }
          else if ((in_RDI->connectionType == ConnectionTypeHTTP2) ||
                  (in_RDI->connectionType == ConnectionTypeHTTP2Direct)) {
            local_50._M_node = (_Base_ptr)0xaaaaaaaaaaaaaaaa;
            local_50._M_node =
                 (_Base_ptr)
                 QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::begin
                           ((QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)
                            in_stack_ffffffffffffff40);
            local_58._M_node = (_Base_ptr)0xaaaaaaaaaaaaaaaa;
            local_58._M_node =
                 (_Base_ptr)
                 QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::end
                           ((QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)
                            in_stack_ffffffffffffff40);
            while (bVar1 = ::operator!=((const_iterator *)in_RDI,
                                        (const_iterator *)
                                        CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28
                                                )), bVar1) {
              QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::const_iterator::
              operator*((const_iterator *)0x2f002e);
              emitReplyError((QHttpNetworkConnectionPrivate *)
                             CONCAT17(bVar4,CONCAT16(bVar3,CONCAT15(bVar2,in_stack_ffffffffffffff70)
                                                    )),socket,in_stack_ffffffffffffff60,
                             in_stack_ffffffffffffff5c);
              QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::const_iterator::
              operator++((const_iterator *)in_RDI);
            }
          }
          else {
            QMessageLogger::QMessageLogger
                      ((QMessageLogger *)in_stack_ffffffffffffff40,(char *)in_stack_ffffffffffffff38
                       ,(int)((ulong)in_RDI >> 0x20),
                       (char *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
            QMessageLogger::debug
                      (local_78,
                       "QHttpNetworkConnectionPrivate::_q_hostLookupFinished could not de-queue request, failed to report HostNotFoundError"
                      );
            in_RDI->networkLayerState = Unknown;
          }
        }
        else {
          in_RDI->networkLayerState = IPv6;
          q_func(in_RDI);
          QMetaObject::invokeMethod<>
                    (in_stack_ffffffffffffff48,(char *)in_stack_ffffffffffffff40,
                     (ConnectionType)((ulong)in_stack_ffffffffffffff38 >> 0x20));
        }
      }
      else {
        in_RDI->networkLayerState = IPv4;
        q_func(in_RDI);
        QMetaObject::invokeMethod<>
                  (in_stack_ffffffffffffff48,(char *)in_stack_ffffffffffffff40,
                   (ConnectionType)((ulong)in_stack_ffffffffffffff38 >> 0x20));
      }
    }
    else {
      startNetworkLayerStateLookup(in_RDI);
    }
    QList<QHostAddress>::~QList((QList<QHostAddress> *)0x2f00b7);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHttpNetworkConnectionPrivate::_q_hostLookupFinished(const QHostInfo &info)
{
    bool bIpv4 = false;
    bool bIpv6 = false;
    bool foundAddress = false;
    if (networkLayerState == IPv4 || networkLayerState == IPv6 || networkLayerState == IPv4or6)
        return;

    const auto addresses = info.addresses();
    for (const QHostAddress &address : addresses) {
        const QAbstractSocket::NetworkLayerProtocol protocol = address.protocol();
        if (protocol == QAbstractSocket::IPv4Protocol) {
            if (!foundAddress) {
                foundAddress = true;
                delayIpv4 = false;
            }
            bIpv4 = true;
        } else if (protocol == QAbstractSocket::IPv6Protocol) {
            if (!foundAddress) {
                foundAddress = true;
                delayIpv4 = true;
            }
            bIpv6 = true;
        }
    }

    if (bIpv4 && bIpv6)
        startNetworkLayerStateLookup();
    else if (bIpv4) {
        networkLayerState = QHttpNetworkConnectionPrivate::IPv4;
        QMetaObject::invokeMethod(this->q_func(), "_q_startNextRequest", Qt::QueuedConnection);
    } else if (bIpv6) {
        networkLayerState = QHttpNetworkConnectionPrivate::IPv6;
        QMetaObject::invokeMethod(this->q_func(), "_q_startNextRequest", Qt::QueuedConnection);
    } else {
        auto lookupError = QNetworkReply::HostNotFoundError;
#ifndef QT_NO_NETWORKPROXY
        // if the proxy can lookup hostnames, all hostname lookups except for the lookup of the
        // proxy hostname are delegated to the proxy.
        auto proxyCapabilities = networkProxy.capabilities() | channels[0].proxy.capabilities();
        if (proxyCapabilities & QNetworkProxy::HostNameLookupCapability)
            lookupError = QNetworkReply::ProxyNotFoundError;
#endif
        if (dequeueRequest(channels[0].socket)) {
            emitReplyError(channels[0].socket, channels[0].reply, lookupError);
            networkLayerState = QHttpNetworkConnectionPrivate::Unknown;
        } else if (connectionType == QHttpNetworkConnection::ConnectionTypeHTTP2
                   || connectionType == QHttpNetworkConnection::ConnectionTypeHTTP2Direct) {
            for (const HttpMessagePair &h2Pair : std::as_const(channels[0].h2RequestsToSend)) {
                // emit error for all replies
                QHttpNetworkReply *currentReply = h2Pair.second;
                Q_ASSERT(currentReply);
                emitReplyError(channels[0].socket, currentReply, lookupError);
            }
        } else {
            // We can end up here if a request has been aborted or otherwise failed (e.g. timeout)
            // before the host lookup was finished.
            qDebug("QHttpNetworkConnectionPrivate::_q_hostLookupFinished"
                   " could not de-queue request, failed to report HostNotFoundError");
            networkLayerState = QHttpNetworkConnectionPrivate::Unknown;
        }
    }
}